

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O2

void __thiscall QFormLayoutPrivate::~QFormLayoutPrivate(QFormLayoutPrivate *this)

{
  *(undefined ***)&this->super_QLayoutPrivate = &PTR__QFormLayoutPrivate_007c6580;
  QArrayDataPointer<QLayoutStruct>::~QArrayDataPointer(&(this->hfwLayouts).d);
  QArrayDataPointer<QLayoutStruct>::~QArrayDataPointer(&(this->vLayouts).d);
  QArrayDataPointer<QFormLayoutItem_*>::~QArrayDataPointer(&(this->m_things).d);
  QArrayDataPointer<QFormLayoutItem_*>::~QArrayDataPointer
            ((QArrayDataPointer<QFormLayoutItem_*> *)&this->m_matrix);
  QObjectPrivate::~QObjectPrivate((QObjectPrivate *)this);
  return;
}

Assistant:

~QFormLayoutPrivate() { }